

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

void __thiscall Chromosome::calcFitness(Chromosome *this)

{
  size_type sVar1;
  long lVar2;
  undefined1 auVar3 [16];
  Chromosome *this_local;
  
  this->fitness = 1.0;
  sVar1 = std::
          vector<std::pair<Coordinate,_Coordinate>,_std::allocator<std::pair<Coordinate,_Coordinate>_>_>
          ::size(&this->pairs);
  lVar2 = sVar1 * 100;
  auVar3._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar3._0_8_ = lVar2;
  auVar3._12_4_ = 0x45300000;
  this->fitness =
       (auVar3._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0) + this->fitness;
  if (0 < this->collisions) {
    if (this->collisions == 1) {
      this->collisions = this->collisions + 1;
    }
    this->fitness = this->fitness / (double)(this->collisions * this->collisions);
  }
  return;
}

Assistant:

void Chromosome::calcFitness() {

   // std::cout << "pairs" << pairs.size() << std::endl;
   // std::cout << "collisions" << collisions << std::endl;

    fitness = 1;
    fitness += pairs.size() * 100;
    if ((collisions) > 0){
        if (collisions == 1){
            collisions++;
        }
        fitness /= (collisions*collisions);
    }

   // std::cout << "fitness" << fitness << std::endl;


}